

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_f1a6f8::HandleCompareCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *psVar1;
  cmExecutionStatus *this;
  bool bVar2;
  __type _Var3;
  size_type sVar4;
  cmMakefile *pcVar5;
  undefined1 local_e0 [8];
  string e;
  string_view local_b0;
  bool local_99;
  const_reference pvStack_98;
  bool result;
  string *outvar;
  string *right;
  string *left;
  string e_1;
  string *mode;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  this = local_20;
  if (sVar4 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"sub-command COMPARE requires a mode to be specified.",&local_41)
    ;
    cmExecutionStatus::SetError(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
  }
  else {
    e_1.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)status_local,1);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            e_1.field_2._8_8_,"EQUAL");
    if ((((bVar2) ||
         (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)e_1.field_2._8_8_,"NOTEQUAL"), bVar2)) ||
        (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)e_1.field_2._8_8_,"LESS"), bVar2)) ||
       (((bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)e_1.field_2._8_8_,"LESS_EQUAL"), bVar2 ||
         (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)e_1.field_2._8_8_,"GREATER"), bVar2)) ||
        (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)e_1.field_2._8_8_,"GREATER_EQUAL"), bVar2)))) {
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)status_local);
      if (sVar4 < 5) {
        cmStrCat<char_const(&)[27],std::__cxx11::string_const&,char_const(&)[46]>
                  ((string *)&left,(char (*) [27])"sub-command COMPARE, mode ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   e_1.field_2._8_8_,(char (*) [46])0x1149d5a);
        cmExecutionStatus::SetError(local_20,(string *)&left);
        args_local._7_1_ = 0;
        std::__cxx11::string::~string((string *)&left);
      }
      else {
        right = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)status_local,2);
        outvar = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)status_local,3);
        pvStack_98 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)status_local,4);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )e_1.field_2._8_8_,"LESS");
        if (bVar2) {
          local_99 = std::operator<(right,outvar);
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)e_1.field_2._8_8_,"LESS_EQUAL");
          if (bVar2) {
            local_99 = std::operator<=(right,outvar);
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)e_1.field_2._8_8_,"GREATER");
            if (bVar2) {
              local_99 = std::operator>(right,outvar);
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)e_1.field_2._8_8_,"GREATER_EQUAL");
              if (bVar2) {
                local_99 = std::operator>=(right,outvar);
              }
              else {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)e_1.field_2._8_8_,"EQUAL");
                if (bVar2) {
                  local_99 = std::operator==(right,outvar);
                }
                else {
                  _Var3 = std::operator==(right,outvar);
                  local_99 = (bool)((_Var3 ^ 0xffU) & 1);
                }
              }
            }
          }
        }
        if (local_99 == false) {
          pcVar5 = cmExecutionStatus::GetMakefile(local_20);
          psVar1 = pvStack_98;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)((long)&e.field_2 + 8),"0")
          ;
          cmMakefile::AddDefinition(pcVar5,psVar1,stack0xffffffffffffff40);
        }
        else {
          pcVar5 = cmExecutionStatus::GetMakefile(local_20);
          psVar1 = pvStack_98;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b0,"1");
          cmMakefile::AddDefinition(pcVar5,psVar1,local_b0);
        }
        args_local._7_1_ = 1;
      }
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                     "sub-command COMPARE does not recognize mode ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     e_1.field_2._8_8_);
      cmExecutionStatus::SetError
                (local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_e0);
      args_local._7_1_ = 0;
      std::__cxx11::string::~string((string *)local_e0);
    }
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleCompareCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("sub-command COMPARE requires a mode to be specified.");
    return false;
  }
  std::string const& mode = args[1];
  if ((mode == "EQUAL") || (mode == "NOTEQUAL") || (mode == "LESS") ||
      (mode == "LESS_EQUAL") || (mode == "GREATER") ||
      (mode == "GREATER_EQUAL")) {
    if (args.size() < 5) {
      std::string e =
        cmStrCat("sub-command COMPARE, mode ", mode,
                 " needs at least 5 arguments total to command.");
      status.SetError(e);
      return false;
    }

    const std::string& left = args[2];
    const std::string& right = args[3];
    const std::string& outvar = args[4];
    bool result;
    if (mode == "LESS") {
      result = (left < right);
    } else if (mode == "LESS_EQUAL") {
      result = (left <= right);
    } else if (mode == "GREATER") {
      result = (left > right);
    } else if (mode == "GREATER_EQUAL") {
      result = (left >= right);
    } else if (mode == "EQUAL") {
      result = (left == right);
    } else // if(mode == "NOTEQUAL")
    {
      result = !(left == right);
    }
    if (result) {
      status.GetMakefile().AddDefinition(outvar, "1");
    } else {
      status.GetMakefile().AddDefinition(outvar, "0");
    }
    return true;
  }
  std::string e = "sub-command COMPARE does not recognize mode " + mode;
  status.SetError(e);
  return false;
}